

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryGrow
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemoryGrow *curr)

{
  ExternalInterface *pEVar1;
  Name memory_00;
  Name memory_01;
  bool bVar2;
  uint uVar3;
  ExpressionRunner<wasm::ModuleRunner> *this_00;
  long lVar4;
  address64_t aVar5;
  ulong uVar6;
  Name NVar7;
  bool local_28a;
  bool local_289;
  Literal local_220;
  Address local_208;
  Address local_200;
  ModuleRunner *local_1f8;
  size_t sStack_1f0;
  Literal local_1e0;
  ulong local_1c8;
  uint64_t newSize;
  BasicType local_1a4;
  Literal local_1a0;
  BasicType local_184;
  ulong local_180;
  uint64_t delta;
  Literal local_170;
  undefined1 local_158 [8];
  Flow ret;
  undefined1 local_108 [8];
  Literal fail;
  Type indexType;
  Memory *memory;
  Address local_b0;
  Address memorySize;
  undefined1 local_90 [8];
  MemoryInstanceInfo info;
  undefined1 local_68 [8];
  Flow flow;
  MemoryGrow *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  this_00 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,this_00,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x10)
            );
  bVar2 = Flow::breaking((Flow *)local_68);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    info.name.super_IString.str._M_str._0_4_ = 1;
  }
  else {
    memorySize.addr = (((IString *)(flow.breakTo.super_IString.str._M_str + 0x20))->str)._M_len;
    getMemoryInstanceInfo
              ((MemoryInstanceInfo *)local_90,this,
               (Name)((IString *)(flow.breakTo.super_IString.str._M_str + 0x20))->str);
    memory_01.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memory_01.super_IString.str._M_len = (size_t)info.instance;
    local_b0 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_90,memory_01);
    NVar7.super_IString.str._M_str = (char *)info.instance;
    NVar7.super_IString.str._M_len = (size_t)*(Module **)((long)local_90 + 0x20);
    lVar4 = ::wasm::Module::getMemory(NVar7);
    fail.type.id = *(uintptr_t *)(lVar4 + 0x50);
    ret.breakTo.super_IString.str._M_str = *(char **)(lVar4 + 0x50);
    wasm::Literal::makeFromInt64((Literal *)local_108,-1,(Type)ret.breakTo.super_IString.str._M_str)
    ;
    aVar5 = Address::operator_cast_to_unsigned_long(&local_b0);
    delta = fail.type.id;
    wasm::Literal::makeFromInt64(&local_170,aVar5,fail.type);
    Flow::Flow((Flow *)local_158,&local_170);
    ::wasm::Literal::~Literal(&local_170);
    Flow::getSingleValue((Flow *)local_68);
    local_180 = ::wasm::Literal::getUnsigned();
    local_289 = false;
    if (0xffff < local_180) {
      local_184 = i32;
      local_289 = Type::operator==(&fail.type,&local_184);
    }
    if (local_289 == false) {
      aVar5 = Address::operator_cast_to_unsigned_long(&local_b0);
      local_28a = false;
      if (0xffffffff - local_180 <= aVar5) {
        local_1a4 = i32;
        local_28a = Type::operator==(&fail.type,&local_1a4);
      }
      if (local_28a == false) {
        aVar5 = Address::operator_cast_to_unsigned_long(&local_b0);
        uVar6 = aVar5 + local_180;
        local_1c8 = uVar6;
        aVar5 = Address::operator_cast_to_unsigned_long((Address *)(lVar4 + 0x40));
        if (aVar5 < uVar6) {
          ::wasm::Literal::Literal(&local_1e0,(Literal *)local_108);
          Flow::Flow(__return_storage_ptr__,&local_1e0);
          ::wasm::Literal::~Literal(&local_1e0);
        }
        else {
          pEVar1 = *(ExternalInterface **)((long)local_90 + 0x288);
          local_1f8 = info.instance;
          sStack_1f0 = info.name.super_IString.str._M_len;
          aVar5 = Address::operator_cast_to_unsigned_long(&local_b0);
          Address::Address(&local_200,aVar5 << 0x10);
          Address::Address(&local_208,local_1c8 << 0x10);
          uVar3 = (*pEVar1->_vptr_ExternalInterface[6])
                            (pEVar1,local_1f8,sStack_1f0,local_200.addr,local_208.addr);
          if ((uVar3 & 1) == 0) {
            ::wasm::Literal::Literal(&local_220,(Literal *)local_108);
            Flow::Flow(__return_storage_ptr__,&local_220);
            ::wasm::Literal::~Literal(&local_220);
          }
          else {
            Address::operator=(&local_b0,local_1c8);
            memory_00.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
            memory_00.super_IString.str._M_len = (size_t)info.instance;
            setMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_90,memory_00,local_b0);
            Flow::Flow(__return_storage_ptr__,(Flow *)local_158);
          }
        }
      }
      else {
        ::wasm::Literal::Literal((Literal *)&newSize,(Literal *)local_108);
        Flow::Flow(__return_storage_ptr__,(Literal *)&newSize);
        ::wasm::Literal::~Literal((Literal *)&newSize);
      }
    }
    else {
      ::wasm::Literal::Literal(&local_1a0,(Literal *)local_108);
      Flow::Flow(__return_storage_ptr__,&local_1a0);
      ::wasm::Literal::~Literal(&local_1a0);
    }
    info.name.super_IString.str._M_str._0_4_ = 1;
    Flow::~Flow((Flow *)local_158);
    ::wasm::Literal::~Literal((Literal *)local_108);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemoryGrow(MemoryGrow* curr) {
    NOTE_ENTER("MemoryGrow");
    Flow flow = self()->visit(curr->delta);
    if (flow.breaking()) {
      return flow;
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto* memory = info.instance->wasm.getMemory(info.name);
    auto indexType = memory->indexType;
    auto fail = Literal::makeFromInt64(-1, memory->indexType);
    Flow ret = Literal::makeFromInt64(memorySize, indexType);
    uint64_t delta = flow.getSingleValue().getUnsigned();
    if (delta > uint32_t(-1) / Memory::kPageSize && indexType == Type::i32) {
      return fail;
    }
    if (memorySize >= uint32_t(-1) - delta && indexType == Type::i32) {
      return fail;
    }
    auto newSize = memorySize + delta;
    if (newSize > memory->max) {
      return fail;
    }
    if (!info.instance->externalInterface->growMemory(
          info.name,
          memorySize * Memory::kPageSize,
          newSize * Memory::kPageSize)) {
      // We failed to grow the memory in practice, even though it was valid
      // to try to do so.
      return fail;
    }
    memorySize = newSize;
    info.instance->setMemorySize(info.name, memorySize);
    return ret;
  }